

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraKateGenerator::GenerateFilesString_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  cmGlobalGenerator *pcVar1;
  pointer puVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  pointer puVar5;
  bool bVar6;
  string *psVar7;
  _Rb_tree_node_base *p_Var8;
  char *pcVar9;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  pointer puVar10;
  string *listFile;
  pointer pbVar11;
  pointer puVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_c0;
  undefined1 local_a0 [8];
  _Rb_tree_node_base local_98;
  size_t local_78;
  string local_70;
  string local_50;
  
  psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
  local_98._0_8_ = (psVar7->_M_dataplus)._M_p;
  local_a0 = (undefined1  [8])psVar7->_M_string_length;
  local_98._M_parent = (_Base_ptr)&DAT_00000005;
  local_98._M_left = (_Base_ptr)0x6d8c3d;
  views._M_len = 2;
  views._M_array = (iterator)local_a0;
  cmCatViews_abi_cxx11_(&local_c0,views);
  bVar6 = cmsys::SystemTools::FileExists(&local_c0);
  if (bVar6) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"\"git\": 1 ","");
  }
  else {
    psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    local_98._0_8_ = (psVar7->_M_dataplus)._M_p;
    local_a0 = (undefined1  [8])psVar7->_M_string_length;
    local_98._M_parent = (_Base_ptr)&DAT_00000005;
    local_98._M_left = (_Base_ptr)0x6d8c4d;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_a0;
    cmCatViews_abi_cxx11_(&local_70,views_00);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar6 = cmsys::SystemTools::FileExists(&local_c0);
    if (bVar6) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"\"svn\": 1 ","");
    }
    else {
      psVar7 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
      local_70._M_string_length = (size_type)(psVar7->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)psVar7->_M_string_length;
      local_98._0_8_ = &local_98._M_parent;
      local_a0 = (undefined1  [8])0x1;
      local_98._M_parent = (_Base_ptr)CONCAT71(local_98._M_parent._1_7_,0x2f);
      local_70.field_2._M_allocated_capacity = 1;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_70;
      local_70.field_2._8_8_ = local_98._0_8_;
      cmCatViews_abi_cxx11_(&local_50,views_01);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_98._M_left = &local_98;
      local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
      pcVar9 = (char *)0x0;
      local_98._M_parent = (_Base_ptr)0x0;
      local_78 = 0;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      puVar10 = (pcVar1->LocalGenerators).
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pcVar1->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_98._M_right = local_98._M_left;
      if (puVar10 != puVar2) {
        do {
          pcVar3 = ((puVar10->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
          pbVar4 = *(pointer *)
                    ((long)&(pcVar3->ListFiles).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    + 8);
          for (pbVar11 = *(pointer *)
                          &(pcVar3->ListFiles).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl; pbVar11 != pbVar4; pbVar11 = pbVar11 + 1) {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_a0,__return_storage_ptr__);
          }
          puVar5 = *(pointer *)
                    ((long)&(pcVar3->SourceFiles).
                            super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                    + 8);
          for (puVar12 = *(pointer *)
                          &(pcVar3->SourceFiles).
                           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
                           ._M_impl; puVar12 != puVar5; puVar12 = puVar12 + 1) {
            bVar6 = cmSourceFile::GetIsGenerated
                              ((cmSourceFile *)
                               (puVar12->_M_t).
                               super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                               ,GlobalAndLocal);
            if (!bVar6) {
              cmSourceFile::ResolveFullPath
                        ((cmSourceFile *)
                         (puVar12->_M_t).
                         super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>,
                         (string *)0x0,(string *)0x0);
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_a0,__return_storage_ptr__);
            }
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar2);
        pcVar9 = (char *)__return_storage_ptr__->_M_string_length;
      }
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar9,0x6d8c5d);
      for (p_Var8 = local_98._M_left; p_Var8 != &local_98;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GenerateFilesString(
  const cmLocalGenerator& lg) const
{
  std::string s = cmStrCat(lg.GetSourceDirectory(), "/.git");
  if (cmSystemTools::FileExists(s)) {
    return "\"git\": 1 ";
  }

  s = cmStrCat(lg.GetSourceDirectory(), "/.svn");
  if (cmSystemTools::FileExists(s)) {
    return "\"svn\": 1 ";
  }

  s = cmStrCat(lg.GetSourceDirectory(), '/');

  std::set<std::string> files;
  std::string tmp;
  const auto& lgs = this->GlobalGenerator->GetLocalGenerators();

  for (const auto& lgen : lgs) {
    cmMakefile* makefile = lgen->GetMakefile();
    const std::vector<std::string>& listFiles = makefile->GetListFiles();
    for (std::string const& listFile : listFiles) {
      tmp = listFile;
      {
        files.insert(tmp);
      }
    }

    for (const auto& sf : makefile->GetSourceFiles()) {
      if (sf->GetIsGenerated()) {
        continue;
      }

      tmp = sf->ResolveFullPath();
      files.insert(tmp);
    }
  }

  const char* sep = "";
  tmp = "\"list\": [";
  for (std::string const& f : files) {
    tmp += sep;
    tmp += " \"";
    tmp += f;
    tmp += "\"";
    sep = ",";
  }
  tmp += "] ";

  return tmp;
}